

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testDeserializeNewOrderSingle(int count)

{
  long lVar1;
  pointer pDataDictionary;
  long lVar2;
  int local_40c;
  int i;
  long start;
  string string;
  NewOrderSingle message;
  OrdType ordType;
  TransactTime transactTime;
  Side side;
  STRING local_178;
  undefined1 local_158 [8];
  Symbol symbol;
  undefined1 local_f8 [8];
  HandlInst handlInst;
  allocator<char> local_89;
  STRING local_88;
  undefined1 local_68 [8];
  ClOrdID clOrdID;
  int count_local;
  
  clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum = count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"ORDERID",&local_89);
  FIX::ClOrdID::ClOrdID((ClOrdID *)local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  symbol.super_StringField.super_FieldBase.m_metrics.m_checksum._3_1_ = 0x31;
  FIX::HandlInst::HandlInst
            ((HandlInst *)local_f8,
             (CHAR *)((long)&symbol.super_StringField.super_FieldBase.m_metrics.m_checksum + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"LNUX",
             (allocator<char> *)
             ((long)&side.super_CharField.super_FieldBase.m_metrics.m_checksum + 3));
  FIX::Symbol::Symbol((Symbol *)local_158,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&side.super_CharField.super_FieldBase.m_metrics.m_checksum + 3));
  FIX::Side::Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics,
                  "11FIX.4.2");
  FIX::TransactTime::now();
  FIX::OrdType::OrdType((OrdType *)&message.super_Message.field_0x150,"1FIX.4.2");
  FIX42::NewOrderSingle::NewOrderSingle
            ((NewOrderSingle *)((long)&string.field_2 + 8),(ClOrdID *)local_68,(HandlInst *)local_f8
             ,(Symbol *)local_158,
             (Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics,
             (TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics,
             (OrdType *)&message.super_Message.field_0x150);
  FIX::Message::toString_abi_cxx11_((int)&start,(int)&string + 0x18,8);
  clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum =
       clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum + -1;
  lVar1 = GetTickCount();
  for (local_40c = 0; local_40c <= clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum;
      local_40c = local_40c + 1) {
    pDataDictionary =
         std::unique_ptr<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>::get
                   (&s_dataDictionary);
    FIX::Message::setString
              ((Message *)(string.field_2._M_local_buf + 8),(string *)&start,false,pDataDictionary);
  }
  lVar2 = GetTickCount();
  std::__cxx11::string::~string((string *)&start);
  FIX42::NewOrderSingle::~NewOrderSingle((NewOrderSingle *)((long)&string.field_2 + 8));
  FIX::OrdType::~OrdType((OrdType *)&message.super_Message.field_0x150);
  FIX::TransactTime::~TransactTime
            ((TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics);
  FIX::Side::~Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics);
  FIX::Symbol::~Symbol((Symbol *)local_158);
  FIX::HandlInst::~HandlInst((HandlInst *)local_f8);
  FIX::ClOrdID::~ClOrdID((ClOrdID *)local_68);
  return lVar2 - lVar1;
}

Assistant:

long testDeserializeNewOrderSingle(int count) {
  FIX::ClOrdID clOrdID("ORDERID");
  FIX::HandlInst handlInst('1');
  FIX::Symbol symbol("LNUX");
  FIX::Side side(FIX::Side_BUY);
  FIX::TransactTime transactTime = FIX::TransactTime::now();
  FIX::OrdType ordType(FIX::OrdType_MARKET);
  FIX42::NewOrderSingle message(clOrdID, handlInst, symbol, side, transactTime, ordType);
  std::string string = message.toString();

  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    message.setString(string, DONT_VALIDATE, s_dataDictionary.get());
  }
  return GetTickCount() - start;
}